

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledMultiArg.h
# Opt level: O0

bool __thiscall
TCLAP::
UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator==(UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Arg *a)

{
  __type _Var1;
  string *__rhs;
  __type local_42;
  string local_40;
  Arg *local_20;
  Arg *a_local;
  UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = a;
  a_local = (Arg *)this;
  __rhs = Arg::getName_abi_cxx11_(a);
  _Var1 = std::operator==(&(this->
                           super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).super_Arg._name,__rhs);
  local_42 = true;
  if (!_Var1) {
    Arg::getDescription_abi_cxx11_(&local_40,local_20);
    local_42 = std::operator==(&(this->
                                super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).super_Arg._description,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return local_42 != false;
}

Assistant:

bool UnlabeledMultiArg<T>::operator==(const Arg& a) const
{
	if ( _name == a.getName() || _description == a.getDescription() )
		return true;
	else
		return false;
}